

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QAbstractTextDocumentLayout::Selection>::appendInitialize
          (QArrayDataPointer<QAbstractTextDocumentLayout::Selection> *this,qsizetype newSize)

{
  std::__uninitialized_default_1<false>::__uninit_default<QAbstractTextDocumentLayout::Selection*>
            (this->ptr + this->size,this->ptr + newSize);
  this->size = newSize;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }